

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O3

z_uLong adler32_combine(z_uLong adler1,z_uLong adler2,int len2)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = len2 + (int)((ulong)(long)len2 / 0xfff1) * -0xfff1;
  uVar3 = adler1 & 0xffff;
  uVar4 = uVar3 + (adler2 & 0xffff) + 0xfff0;
  iVar2 = (((adler2 >> 0x10) + (adler1 >> 0x10)) - iVar2) + (uVar3 * iVar2) % 0xfff1;
  uVar1 = iVar2 + 0xfff1;
  uVar3 = ((adler2 & 0xffff) + uVar3) - 1;
  if (uVar4 < 0xfff2) {
    uVar3 = uVar4;
  }
  uVar4 = uVar3 - 0xfff1;
  if (uVar3 < 0xfff2) {
    uVar4 = uVar3;
  }
  uVar3 = iVar2 - 0xfff1;
  if (uVar1 < 0x1ffe3) {
    uVar3 = uVar1;
  }
  uVar1 = uVar3 * 0x10000 + 0xf0000;
  if (uVar3 < 0xfff2) {
    uVar1 = uVar3 * 0x10000;
  }
  return uVar1 | uVar4;
}

Assistant:

uLong ZEXPORT adler32_combine(adler1, adler2, len2)
    uLong adler1;
    uLong adler2;
    z_off_t len2;
{
    unsigned int sum1;
    unsigned int sum2;
    unsigned rem;

    /* the derivation of this formula is left as an exercise for the reader */
    rem = (unsigned)(len2 % BASE);
    sum1 = adler1 & 0xffff;
    sum2 = rem * sum1;
    MOD(sum2);
    sum1 += (adler2 & 0xffff) + BASE - 1;
    sum2 += ((adler1 >> 16) & 0xffff) + ((adler2 >> 16) & 0xffff) + BASE - rem;
    if (sum1 > BASE) sum1 -= BASE;
    if (sum1 > BASE) sum1 -= BASE;
    if (sum2 > (BASE << 1)) sum2 -= (BASE << 1);
    if (sum2 > BASE) sum2 -= BASE;
    return sum1 | (sum2 << 16);
}